

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<std::function<cs_impl::any()>const&,std::type_index_const&>
          (holder<cs::type_t> *this,function<cs_impl::any_()> *args,type_index *args_1)

{
  type_index *in_RDX;
  baseHolder *in_RDI;
  type_id *i;
  type_index in_stack_ffffffffffffffa8;
  type_t *in_stack_ffffffffffffffb0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006b7218;
  i = (type_id *)(in_RDI + 1);
  std::function<cs_impl::any_()>::function
            (&in_stack_ffffffffffffffb0->constructor,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffffa8._M_target);
  cs::type_id::type_id((type_id *)&stack0xffffffffffffffa8,in_RDX,0);
  cs::type_t::type_t(in_stack_ffffffffffffffb0,
                     (function<cs_impl::any_()> *)in_stack_ffffffffffffffa8._M_target,i);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x54c442);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}